

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O1

void __thiscall
capnp::_::anon_unknown_0::RpcConnectionState::RpcCallContext::~RpcCallContext(RpcCallContext *this)

{
  PromiseFulfiller<void> *pPVar1;
  Disposer *pDVar2;
  PromiseFulfiller<capnp::AnyPointer::Pipeline> *pPVar3;
  RpcServerResponse *pRVar4;
  Maybe<kj::Own<capnp::ClientHook>_> *pMVar5;
  size_t sVar6;
  ArrayDisposer *pAVar7;
  IncomingRpcMessage *pIVar8;
  RpcConnectionState *pRVar9;
  bool bVar10;
  anon_class_8_1_8991fb9c_for_func local_28;
  Runnable local_20;
  RpcCallContext *local_18;
  
  if (this->responseSent == false) {
    this->responseSent = true;
    local_28.this = this;
    bVar10 = kj::UnwindDetector::isUnwinding(&this->unwindDetector);
    if (bVar10) {
      local_20._vptr_Runnable = (_func_int **)&PTR_run_006451b8;
      local_18 = local_28.this;
      kj::UnwindDetector::catchExceptionsAsSecondaryFaults(&this->unwindDetector,&local_20);
    }
    else {
      kj::_::
      RunnableImpl<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc.c++:1770:51)>
      ::anon_class_8_1_8991fb9c_for_func::operator()(&local_28);
    }
  }
  pPVar1 = (this->cancelFulfiller).ptr;
  if (pPVar1 != (PromiseFulfiller<void> *)0x0) {
    (this->cancelFulfiller).ptr = (PromiseFulfiller<void> *)0x0;
    pDVar2 = (this->cancelFulfiller).disposer;
    (**pDVar2->_vptr_Disposer)
              (pDVar2,pPVar1->_vptr_PromiseFulfiller[-2] + (long)&pPVar1->_vptr_PromiseFulfiller);
  }
  pPVar3 = (this->tailCallPipelineFulfiller).ptr.ptr;
  if (pPVar3 != (PromiseFulfiller<capnp::AnyPointer::Pipeline> *)0x0) {
    (this->tailCallPipelineFulfiller).ptr.ptr = (PromiseFulfiller<capnp::AnyPointer::Pipeline> *)0x0
    ;
    pDVar2 = (this->tailCallPipelineFulfiller).ptr.disposer;
    (**pDVar2->_vptr_Disposer)
              (pDVar2,pPVar3->_vptr_PromiseFulfiller[-2] + (long)&pPVar3->_vptr_PromiseFulfiller);
  }
  pRVar4 = (this->response).ptr.ptr;
  if (pRVar4 != (RpcServerResponse *)0x0) {
    (this->response).ptr.ptr = (RpcServerResponse *)0x0;
    pDVar2 = (this->response).ptr.disposer;
    (**pDVar2->_vptr_Disposer)
              (pDVar2,pRVar4->_vptr_RpcServerResponse[-2] + (long)&pRVar4->_vptr_RpcServerResponse);
  }
  (this->paramsCapTable).super_CapTableReader._vptr_CapTableReader =
       (_func_int **)&PTR_extractCap_00641d60;
  pMVar5 = (this->paramsCapTable).table.ptr;
  if (pMVar5 != (Maybe<kj::Own<capnp::ClientHook>_> *)0x0) {
    sVar6 = (this->paramsCapTable).table.size_;
    (this->paramsCapTable).table.ptr = (Maybe<kj::Own<capnp::ClientHook>_> *)0x0;
    (this->paramsCapTable).table.size_ = 0;
    pAVar7 = (this->paramsCapTable).table.disposer;
    (**pAVar7->_vptr_ArrayDisposer)
              (pAVar7,pMVar5,0x10,sVar6,sVar6,
               kj::ArrayDisposer::Dispose_<kj::Maybe<kj::Own<capnp::ClientHook>_>,_false>::destruct)
    ;
  }
  pIVar8 = (this->request).ptr.ptr;
  if (pIVar8 != (IncomingRpcMessage *)0x0) {
    (this->request).ptr.ptr = (IncomingRpcMessage *)0x0;
    pDVar2 = (this->request).ptr.disposer;
    (**pDVar2->_vptr_Disposer)
              (pDVar2,pIVar8->_vptr_IncomingRpcMessage[-2] + (long)&pIVar8->_vptr_IncomingRpcMessage
              );
  }
  pRVar9 = (this->connectionState).ptr;
  if (pRVar9 != (RpcConnectionState *)0x0) {
    (this->connectionState).ptr = (RpcConnectionState *)0x0;
    pDVar2 = (this->connectionState).disposer;
    (**pDVar2->_vptr_Disposer)
              (pDVar2,(pRVar9->super_ErrorHandler)._vptr_ErrorHandler[-2] +
                      (long)&(pRVar9->super_ErrorHandler)._vptr_ErrorHandler);
  }
  kj::Refcounted::~Refcounted(&this->super_Refcounted);
  return;
}

Assistant:

~RpcCallContext() noexcept(false) {
      if (isFirstResponder()) {
        // We haven't sent a return yet, so we must have been canceled.  Send a cancellation return.
        unwindDetector.catchExceptionsIfUnwinding([&]() {
          // Don't send anything if the connection is broken.
          if (connectionState->connection.is<Connected>()) {
            auto message = connectionState->connection.get<Connected>()->newOutgoingMessage(
                messageSizeHint<rpc::Return>() + sizeInWords<rpc::Payload>());
            auto builder = message->getBody().initAs<rpc::Message>().initReturn();

            builder.setAnswerId(answerId);
            builder.setReleaseParamCaps(false);

            if (redirectResults) {
              // The reason we haven't sent a return is because the results were sent somewhere
              // else.
              builder.setResultsSentElsewhere();
            } else {
              builder.setCanceled();
            }

            message->send();
          }

          cleanupAnswerTable(nullptr, true);
        });
      }
    }